

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall
cimg_library::CImg<float>::CImg<unsigned_int>(CImg<float> *this,CImg<unsigned_int> *img)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *ptrd;
  float *pfVar5;
  ulong uVar6;
  uint *puVar7;
  
  this->_is_shared = false;
  puVar7 = img->_data;
  if (puVar7 != (uint *)0x0) {
    uVar2 = img->_height;
    uVar3 = img->_depth;
    uVar4 = img->_spectrum;
    uVar6 = (ulong)uVar3 * (ulong)uVar4 * (ulong)uVar2 * (ulong)img->_width;
    if (uVar6 != 0) {
      this->_width = img->_width;
      this->_height = uVar2;
      this->_depth = uVar3;
      this->_spectrum = uVar4;
      pfVar5 = (float *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
      this->_data = pfVar5;
      if ((long)uVar6 < 1) {
        return;
      }
      pfVar1 = pfVar5 + uVar6;
      do {
        uVar2 = *puVar7;
        puVar7 = puVar7 + 1;
        *pfVar5 = (float)uVar2;
        pfVar5 = pfVar5 + 1;
      } while (pfVar5 < pfVar1);
      return;
    }
  }
  this->_data = (float *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_depth = 0;
  this->_spectrum = 0;
  return;
}

Assistant:

CImg(const CImg<t>& img):_is_shared(false) {
      const size_t siz = (size_t)img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*img._width*img._height*img._depth*img._spectrum),
                                      img._width,img._height,img._depth,img._spectrum);
        }
        const t *ptrs = img._data; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }